

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c003::TestCheckArrayEqualFalse::RunImpl(TestCheckArrayEqualFalse *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_98;
  int local_74 [5];
  TestDetails local_60;
  int local_40 [2];
  int array2 [3];
  int array1 [3];
  TestResults results;
  TestCheckArrayEqualFalse *this_local;
  
  UnitTest::TestResults::TestResults((TestResults *)(array1 + 1),(TestReporter *)0x0);
  array2[1] = 1;
  array2[2] = 2;
  array1[0] = 3;
  local_40[0] = 1;
  local_40[1] = 2;
  array2[0] = 2;
  UnitTest::TestDetails::TestDetails(&local_60,"","","",0);
  UnitTest::CheckArrayEqual<int[3],int[3]>
            ((TestResults *)(array1 + 1),(int (*) [3])(array2 + 1),(int (*) [3])local_40,3,&local_60
            );
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_74[1] = 1;
  local_74[0] = UnitTest::TestResults::GetFailureCount((TestResults *)(array1 + 1));
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_98,*ppTVar2,200);
  UnitTest::CheckEqual<int,int>(results_00,local_74 + 1,local_74,&local_98);
  return;
}

Assistant:

TEST(CheckArrayEqualFalse)
{
    TestResults results;

    int const array1[3] = { 1, 2, 3 };
    int const array2[3] = { 1, 2, 2 };
    CheckArrayEqual(results, array1, array2, 3, TestDetails("", "", "", 0));
    CHECK_EQUAL(1, results.GetFailureCount());
}